

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL_mock::GLTextureBuffer::resize
          (GLTextureBuffer *this,uint newX,uint newY)

{
  runtime_error *this_00;
  
  TextureBuffer::resize(&this->super_TextureBuffer,newX,newY);
  if ((this->super_TextureBuffer).dim != 1) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"OpenGL error: called 2D resize on 1D texture");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void GLTextureBuffer::resize(unsigned int newX, unsigned int newY) {

  TextureBuffer::resize(newX, newY);

  bind();
  if (dim == 1) {
    throw std::runtime_error("OpenGL error: called 2D resize on 1D texture");
  }
  if (dim == 2) {
  }
  checkGLError();
}